

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O0

MPP_RET mpp_opt_parse(MppOpt opt,int argc,char **argv)

{
  char *pcVar1;
  MppTrieInfo *info_00;
  void *pvVar2;
  int iVar3;
  char *local_70;
  int local_64;
  RK_S32 step;
  MppTrieInfo *node;
  MppOptInfo *info;
  char *next;
  char *opts;
  int local_38;
  RK_S32 opt_next;
  RK_S32 opt_idx;
  MPP_RET ret;
  MppOptImpl *impl;
  char **argv_local;
  int argc_local;
  MppOpt opt_local;
  
  local_38 = 0;
  if ((((opt == (MppOpt)0x0) || (*(long *)((long)opt + 8) == 0)) || (argc < 2)) ||
     (argv == (char **)0x0)) {
    opt_local._4_4_ = MPP_NOK;
  }
  else {
    opt_next = 0;
    while (local_38 <= argc) {
      iVar3 = local_38 + 1;
      pcVar1 = argv[local_38];
      if (local_38 + 1 < argc) {
        local_70 = argv[local_38 + 1];
      }
      else {
        local_70 = (char *)0x0;
      }
      if (pcVar1 == (char *)0x0) break;
      local_38 = iVar3;
      if ((*pcVar1 == '-') && (pcVar1[1] != '\0')) {
        info_00 = (MppTrieInfo *)mpp_trie_get_info(*(undefined8 *)((long)opt + 8),pcVar1 + 1);
        local_64 = 0;
        if (info_00 == (MppTrieInfo *)0x0) {
          _mpp_log_l(2,"mpp_opt","invalid option %s\n",0,pcVar1 + 1);
        }
        else {
          pvVar2 = mpp_trie_info_ctx(info_00);
          if (*(long *)((long)pvVar2 + 0x18) != 0) {
            local_64 = (**(code **)((long)pvVar2 + 0x18))(*opt,local_70);
          }
          if (local_64 < 0) {
            opt_next = local_64;
            break;
          }
          local_38 = local_64 + iVar3;
        }
      }
    }
    opt_local._4_4_ = opt_next;
  }
  return opt_local._4_4_;
}

Assistant:

MPP_RET mpp_opt_parse(MppOpt opt, int argc, char **argv)
{
    MppOptImpl *impl = (MppOptImpl *)opt;
    MPP_RET ret = MPP_NOK;
    RK_S32 opt_idx = 0;

    if (NULL == impl || NULL == impl->trie || argc < 2 || NULL == argv)
        return ret;

    ret = MPP_OK;

    while (opt_idx <= argc) {
        RK_S32 opt_next = opt_idx + 1;
        char *opts = argv[opt_idx++];
        char *next = (opt_next >= argc) ? NULL : argv[opt_next];

        if (NULL == opts)
            break;

        if (opts[0] == '-' && opts[1] != '\0') {
            MppOptInfo *info = NULL;
            MppTrieInfo *node = mpp_trie_get_info(impl->trie, opts + 1);
            RK_S32 step = 0;

            if (NULL == node) {
                mpp_err("invalid option %s\n", opts + 1);
                continue;
            }

            info = mpp_trie_info_ctx(node);
            if (info->proc)
                step = info->proc(impl->ctx, next);

            /* option failure or help */
            if (step < 0) {
                ret = step;
                break;
            }

            opt_idx += step;
        }
    }

    return ret;
}